

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O2

void libchess::UCIService::bestmove
               (string *move,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *ponder_move,ostream *out)

{
  string bestmove_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,"bestmove ",move);
  if ((ponder_move->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::operator+(&local_30," ponder ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ponder_move)
    ;
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::append((char *)&local_50);
  std::operator<<(out,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

static void bestmove(const std::string& move,
                         const std::optional<std::string>& ponder_move = {},
                         std::ostream& out = std::cout) noexcept {
        std::string bestmove_str = "bestmove " + move;
        if (ponder_move) {
            bestmove_str += " ponder " + *ponder_move;
        }
        bestmove_str += "\n";
        out << bestmove_str;
    }